

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O0

string * duckdb::StringUtil::
         Format<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   (string *fmt_str,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_4,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_5,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_6,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_7)

{
  string *in_RCX;
  string *in_RDX;
  string *in_RDI;
  string *in_R8;
  string *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  string *in_stack_00000018;
  string *in_stack_00000020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000030;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000038;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000040;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000048;
  string asStack_140 [32];
  string asStack_120 [32];
  string asStack_100 [32];
  string asStack_e0 [32];
  string asStack_c0 [32];
  string asStack_a0 [48];
  string asStack_70 [32];
  string asStack_50 [72];
  string *params_3_00;
  
  params_3_00 = in_RDI;
  ::std::__cxx11::string::string(asStack_50,in_RDX);
  ::std::__cxx11::string::string(asStack_70,in_RCX);
  ::std::__cxx11::string::string(asStack_a0,in_R8);
  ::std::__cxx11::string::string(asStack_c0,in_R9);
  ::std::__cxx11::string::string(asStack_e0,(string *)in_stack_00000008);
  ::std::__cxx11::string::string(asStack_100,(string *)in_stack_00000010);
  ::std::__cxx11::string::string(asStack_120,(string *)in_stack_00000018);
  ::std::__cxx11::string::string(asStack_140,in_stack_00000020);
  Exception::
  ConstructMessage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,params_3_00,
             in_stack_00000030,in_stack_00000038,in_stack_00000040,in_stack_00000048);
  ::std::__cxx11::string::~string(asStack_140);
  ::std::__cxx11::string::~string(asStack_120);
  ::std::__cxx11::string::~string(asStack_100);
  ::std::__cxx11::string::~string(asStack_e0);
  ::std::__cxx11::string::~string(asStack_c0);
  ::std::__cxx11::string::~string(asStack_a0);
  ::std::__cxx11::string::~string(asStack_70);
  ::std::__cxx11::string::~string(asStack_50);
  return in_RDI;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}